

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.cpp
# Opt level: O0

ShaderCodeBufferDesc * __thiscall
Diligent::ShaderVkImpl::GetConstantBufferDesc(ShaderVkImpl *this,Uint32 Index)

{
  bool bVar1;
  Char *pCVar2;
  element_type *this_00;
  char (*in_R8) [18];
  undefined1 local_70 [8];
  string msg_1;
  Uint32 ResCount;
  undefined1 local_40 [8];
  string msg;
  Uint32 Index_local;
  ShaderVkImpl *this_local;
  
  msg.field_2._12_4_ = Index;
  bVar1 = ShaderBase<Diligent::EngineVkImplTraits>::IsCompiling
                    (&this->super_ShaderBase<Diligent::EngineVkImplTraits>);
  if (bVar1) {
    FormatString<char[109]>
              ((string *)local_40,
               (char (*) [109])
               "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status."
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetConstantBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
               ,0x151);
    std::__cxx11::string::~string((string *)local_40);
  }
  msg_1.field_2._8_4_ = GetResourceCount(this);
  if ((uint)msg.field_2._12_4_ < (uint)msg_1.field_2._8_4_) {
    this_00 = std::
              __shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_pShaderResources);
    this_local = (ShaderVkImpl *)
                 SPIRVShaderResources::GetUniformBufferDesc(this_00,msg.field_2._12_4_);
  }
  else {
    FormatString<char[17],unsigned_int,char[18]>
              ((string *)local_70,(Diligent *)"Resource index (",
               (char (*) [17])((long)&msg.field_2 + 0xc),(uint *)") is out of range",in_R8);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetConstantBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
               ,0x156);
    std::__cxx11::string::~string((string *)local_70);
    this_local = (ShaderVkImpl *)0x0;
  }
  return (ShaderCodeBufferDesc *)this_local;
}

Assistant:

const ShaderCodeBufferDesc* ShaderVkImpl::GetConstantBufferDesc(Uint32 Index) const
{
    DEV_CHECK_ERR(!IsCompiling(), "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status.");

    const Uint32 ResCount = GetResourceCount();
    if (Index >= ResCount)
    {
        UNEXPECTED("Resource index (", Index, ") is out of range");
        return nullptr;
    }

    // Uniform buffers always go first in the list of resources
    return m_pShaderResources->GetUniformBufferDesc(Index);
}